

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtil.h
# Opt level: O3

void TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
               (CGraph *cg,Parameters *params,Count true_triangle_count,
               _func_Estimates_CGraph_ptr_Parameters *func)

{
  pointer pcVar1;
  Parameters PVar2;
  Parameters params_00;
  Parameters params_01;
  EstimatorStats est_stats_00;
  EstimatorStats est_stats_01;
  FILE *pFVar3;
  int iVar4;
  long *plVar5;
  DIR *__dirp;
  undefined8 *puVar6;
  int *piVar7;
  FILE *__stream;
  size_type *psVar8;
  long *plVar9;
  ulong uVar10;
  undefined8 uVar11;
  long lVar12;
  string mkdir;
  vector<Estimates,_std::allocator<Estimates>_> estimates;
  string directory;
  string out_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Estimates est;
  EstimatorStats est_stats;
  undefined8 in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa20;
  _Alloc_hider in_stack_fffffffffffffa28;
  _Alloc_hider _Var13;
  size_type in_stack_fffffffffffffa30;
  size_type sVar14;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffffa40;
  pointer pEVar16;
  iterator __position;
  Estimates *pEVar17;
  _Alloc_hider in_stack_fffffffffffffa70;
  _Alloc_hider _Var18;
  size_type in_stack_fffffffffffffa78;
  size_type sVar19;
  undefined8 in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  _Alloc_hider in_stack_fffffffffffffa90;
  _Alloc_hider __name;
  size_type in_stack_fffffffffffffa98;
  size_type sVar20;
  undefined8 in_stack_fffffffffffffaa0;
  undefined8 uVar21;
  undefined8 in_stack_fffffffffffffaa8;
  _Alloc_hider in_stack_fffffffffffffab0;
  size_type in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  ulong *local_530;
  long local_528;
  ulong local_520 [2];
  long *local_510;
  undefined8 local_508;
  long local_500;
  undefined8 uStack_4f8;
  Estimates local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  long *local_4b0;
  long local_4a8;
  long local_4a0;
  long lStack_498;
  long *local_490;
  long local_488;
  long local_480;
  long lStack_478;
  long *local_470;
  long local_468;
  long local_460;
  long lStack_458;
  long *local_450;
  long local_448;
  long local_440;
  long lStack_438;
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  vector<Estimates,_std::allocator<Estimates>_> local_410;
  string local_3f8;
  string local_3d8;
  EstimatorStats local_3b8;
  Parameters local_378;
  Parameters local_2d0;
  Parameters local_228;
  Parameters local_180;
  Parameters local_d8;
  
  pEVar16 = (pointer)0x0;
  __position._M_current = (Estimates *)0x0;
  pEVar17 = (Estimates *)0x0;
  if (0 < params->no_of_repeat) {
    lVar12 = 0;
    do {
      std::chrono::_V2::system_clock::now();
      Parameters::Parameters(&local_378,params);
      PVar2.filename._M_string_length = in_stack_fffffffffffff9f0;
      PVar2.filename._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9e8;
      PVar2.filename.field_2._M_allocated_capacity = in_stack_fffffffffffff9f8;
      PVar2.filename.field_2._8_8_ = in_stack_fffffffffffffa00;
      PVar2.seed_count = in_stack_fffffffffffffa08;
      PVar2.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa10;
      PVar2.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa18;
      PVar2.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa20;
      PVar2.walk_length = (EdgeIdx)in_stack_fffffffffffffa28._M_p;
      PVar2.subsample_size = in_stack_fffffffffffffa30;
      PVar2._80_8_ = in_stack_fffffffffffffa38;
      PVar2.sparsification_prob = (double)in_stack_fffffffffffffa40;
      PVar2.algo_name._M_dataplus._M_p = (pointer)pEVar16;
      PVar2.algo_name._M_string_length = (size_type)__position._M_current;
      PVar2.algo_name.field_2._M_allocated_capacity = (size_type)pEVar17;
      PVar2.algo_name.field_2._8_8_ = true_triangle_count;
      PVar2.out_directory._M_dataplus._M_p = (pointer)cg;
      PVar2.out_directory._M_string_length = (size_type)in_stack_fffffffffffffa70._M_p;
      PVar2.out_directory.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
      PVar2.out_directory.field_2._8_8_ = in_stack_fffffffffffffa80;
      PVar2.print_to_console = (bool)(char)in_stack_fffffffffffffa88;
      PVar2.print_to_file = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 8);
      PVar2.normalization_count_available = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x10);
      PVar2.CSS = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x18);
      PVar2.NB = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x20);
      PVar2._165_3_ = (int3)((ulong)in_stack_fffffffffffffa88 >> 0x28);
      (*func)(&local_4f0,cg,PVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.out_directory._M_dataplus._M_p != &local_378.out_directory.field_2) {
        operator_delete(local_378.out_directory._M_dataplus._M_p,
                        local_378.out_directory.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.algo_name._M_dataplus._M_p != &local_378.algo_name.field_2) {
        operator_delete(local_378.algo_name._M_dataplus._M_p,
                        local_378.algo_name.field_2._M_allocated_capacity + 1);
      }
      if (local_378.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_378.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_378.seed_vertices.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_378.seed_vertices.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.filename._M_dataplus._M_p != &local_378.filename.field_2) {
        operator_delete(local_378.filename._M_dataplus._M_p,
                        local_378.filename.field_2._M_allocated_capacity + 1);
      }
      std::chrono::_V2::system_clock::now();
      if (__position._M_current == pEVar17) {
        std::vector<Estimates,std::allocator<Estimates>>::_M_realloc_insert<Estimates_const&>
                  ((vector<Estimates,std::allocator<Estimates>> *)&stack0xfffffffffffffa48,
                   __position,&local_4f0);
      }
      else {
        (__position._M_current)->fraction_of_edges_seen = local_4f0.fraction_of_edges_seen;
        (__position._M_current)->query_complexity = local_4f0.query_complexity;
        (__position._M_current)->estimate = local_4f0.estimate;
        (__position._M_current)->fraction_of_vertices_seen = local_4f0.fraction_of_vertices_seen;
        __position._M_current = __position._M_current + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < params->no_of_repeat);
  }
  std::vector<Estimates,_std::allocator<Estimates>_>::vector
            (&local_410,(vector<Estimates,_std::allocator<Estimates>_> *)&stack0xfffffffffffffa48);
  GetErrorStatistics(&local_3b8,&local_410,true_triangle_count);
  if (local_410.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_410.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_410.super__Vector_base<Estimates,_std::allocator<Estimates>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_410.super__Vector_base<Estimates,_std::allocator<Estimates>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pFVar3 = _stdout;
  if (params->print_to_console == true) {
    Parameters::Parameters(&local_228,params);
    WriteHeaderInOutput(pFVar3,&local_228,cg,true_triangle_count);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.out_directory._M_dataplus._M_p != &local_228.out_directory.field_2) {
      operator_delete(local_228.out_directory._M_dataplus._M_p,
                      local_228.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.algo_name._M_dataplus._M_p != &local_228.algo_name.field_2) {
      operator_delete(local_228.algo_name._M_dataplus._M_p,
                      local_228.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_228.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_228.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.filename._M_dataplus._M_p != &local_228.filename.field_2) {
      operator_delete(local_228.filename._M_dataplus._M_p,
                      local_228.filename.field_2._M_allocated_capacity + 1);
    }
    pFVar3 = _stdout;
    pcVar1 = (params->algo_name)._M_dataplus._M_p;
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3d8,pcVar1,pcVar1 + (params->algo_name)._M_string_length);
    Parameters::Parameters(&local_d8,params);
    params_00.filename._M_string_length = (size_type)local_3b8.mean_error_percentage;
    params_00.filename._M_dataplus._M_p = (pointer)local_3b8._0_8_;
    params_00.filename.field_2._M_allocated_capacity = (size_type)local_3b8.median_error_percentage;
    params_00.filename.field_2._8_8_ = local_3b8.stddev_error_percentage;
    params_00.seed_count = (VertexIdx)local_3b8.max_error_percentage;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_3b8.vertices_seen_max_percentage;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_3b8.edges_seen_max_percentage;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.query_complexity_max_percentage;
    params_00.walk_length = (EdgeIdx)in_stack_fffffffffffffa28._M_p;
    params_00.subsample_size = in_stack_fffffffffffffa30;
    params_00._80_8_ = in_stack_fffffffffffffa38;
    params_00.sparsification_prob = (double)in_stack_fffffffffffffa40;
    params_00.algo_name._M_dataplus._M_p = (pointer)pEVar16;
    params_00.algo_name._M_string_length = (size_type)__position._M_current;
    params_00.algo_name.field_2._M_allocated_capacity = (size_type)pEVar17;
    params_00.algo_name.field_2._8_8_ = true_triangle_count;
    params_00.out_directory._M_dataplus._M_p = (pointer)cg;
    params_00.out_directory._M_string_length = (size_type)in_stack_fffffffffffffa70._M_p;
    params_00.out_directory.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
    params_00.out_directory.field_2._8_8_ = in_stack_fffffffffffffa80;
    params_00.print_to_console = (bool)(char)in_stack_fffffffffffffa88;
    params_00.print_to_file = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 8);
    params_00.normalization_count_available = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x10)
    ;
    params_00.CSS = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x18);
    params_00.NB = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x20);
    params_00._165_3_ = (int3)((ulong)in_stack_fffffffffffffa88 >> 0x28);
    est_stats_00.mean_error_percentage = (double)in_stack_fffffffffffffa98;
    est_stats_00._0_8_ = in_stack_fffffffffffffa90._M_p;
    est_stats_00.median_error_percentage = (double)in_stack_fffffffffffffaa0;
    est_stats_00.stddev_error_percentage = (double)in_stack_fffffffffffffaa8;
    est_stats_00.max_error_percentage = (double)in_stack_fffffffffffffab0._M_p;
    est_stats_00.vertices_seen_max_percentage = (double)in_stack_fffffffffffffab8;
    est_stats_00.edges_seen_max_percentage = (double)in_stack_fffffffffffffac0;
    est_stats_00.query_complexity_max_percentage = (double)in_stack_fffffffffffffac8;
    WriteAlgorithmOutput(pFVar3,&local_3d8,params_00,est_stats_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.out_directory._M_dataplus._M_p != &local_d8.out_directory.field_2) {
      operator_delete(local_d8.out_directory._M_dataplus._M_p,
                      local_d8.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.algo_name._M_dataplus._M_p != &local_d8.algo_name.field_2) {
      operator_delete(local_d8.algo_name._M_dataplus._M_p,
                      local_d8.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_d8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_d8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.filename._M_dataplus._M_p != &local_d8.filename.field_2) {
      operator_delete(local_d8.filename._M_dataplus._M_p,
                      local_d8.filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    WriteRawData(_stdout,(vector<Estimates,_std::allocator<Estimates>_> *)&stack0xfffffffffffffa48);
  }
  if (params->print_to_file != true) goto LAB_00110e46;
  GetTimestamp_abi_cxx11_();
  std::__cxx11::string::find_last_of((char *)params,0x116461,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&stack0xfffffffffffffab0,(ulong)params);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffa70,&params->out_directory,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffab0);
  plVar5 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffa70);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    uVar11 = *psVar8;
    in_stack_fffffffffffffa40 = plVar5[3];
    _Var13._M_p = &stack0xfffffffffffffa38;
  }
  else {
    uVar11 = *psVar8;
    _Var13._M_p = (pointer)*plVar5;
  }
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             (&stack0xfffffffffffffa28,(ulong)(params->algo_name)._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    uVar21 = *psVar8;
    in_stack_fffffffffffffaa8 = plVar5[3];
    __name._M_p = &stack0xfffffffffffffaa0;
  }
  else {
    uVar21 = *psVar8;
    __name._M_p = (pointer)*plVar5;
  }
  sVar20 = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (_Var13._M_p != &stack0xfffffffffffffa38) {
    operator_delete(_Var13._M_p,uVar11 + 1);
  }
  _Var18._M_p = &stack0xfffffffffffffa80;
  if (in_stack_fffffffffffffa70._M_p != _Var18._M_p) {
    operator_delete(in_stack_fffffffffffffa70._M_p,in_stack_fffffffffffffa80 + 1);
  }
  __dirp = opendir(__name._M_p);
  if (__dirp == (DIR *)0x0) {
    piVar7 = __errno_location();
    if (*piVar7 == 2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffa28,"mkdir -p ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffa90);
      iVar4 = system(_Var13._M_p);
      if (iVar4 != -1) {
        if (_Var13._M_p != &stack0xfffffffffffffa38) {
          operator_delete(_Var13._M_p,uVar11 + 1);
        }
        goto LAB_001105f9;
      }
      printf("Could not create directory output/%s/%s\n",in_stack_fffffffffffffab0._M_p,
             (params->algo_name)._M_dataplus._M_p);
      if (_Var13._M_p != &stack0xfffffffffffffa38) {
        operator_delete(_Var13._M_p,uVar11 + 1);
      }
    }
    else {
      printf("Could not create/find directory output/%s/%s\n",in_stack_fffffffffffffab0._M_p,
             (params->algo_name)._M_dataplus._M_p);
    }
    if (__name._M_p != &stack0xfffffffffffffaa0) goto LAB_00110df4;
  }
  else {
    closedir(__dirp);
LAB_001105f9:
    local_530 = local_520;
    std::__cxx11::string::_M_construct<char*>((string *)&local_530,__name._M_p,__name._M_p + sVar20)
    ;
    std::__cxx11::string::append((char *)&local_530);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_4d0,vsnprintf,0x148,"%f",SUB84(params->sparsification_prob,0));
    uVar10 = 0xf;
    if (local_530 != local_520) {
      uVar10 = local_520[0];
    }
    if (uVar10 < local_4d0._M_string_length + local_528) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        uVar11 = local_4d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_4d0._M_string_length + local_528) goto LAB_001106be;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_4d0,0,(char *)0x0,(ulong)local_530);
    }
    else {
LAB_001106be:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_4d0._M_dataplus._M_p)
      ;
    }
    local_510 = &local_500;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_500 = *plVar5;
      uStack_4f8 = puVar6[3];
    }
    else {
      local_500 = *plVar5;
      local_510 = (long *)*puVar6;
    }
    local_508 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_510);
    local_4b0 = &local_4a0;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_4a0 = *plVar9;
      lStack_498 = plVar5[3];
    }
    else {
      local_4a0 = *plVar9;
      local_4b0 = (long *)*plVar5;
    }
    local_4a8 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_4f0.estimate);
    local_490 = &local_480;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_480 = *plVar9;
      lStack_478 = plVar5[3];
    }
    else {
      local_480 = *plVar9;
      local_490 = (long *)*plVar5;
    }
    local_488 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_490);
    local_470 = &local_460;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_460 = *plVar9;
      lStack_458 = plVar5[3];
    }
    else {
      local_460 = *plVar9;
      local_470 = (long *)*plVar5;
    }
    local_468 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_470,(ulong)in_stack_fffffffffffffab0._M_p);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_440 = *plVar9;
      lStack_438 = plVar5[3];
      local_450 = &local_440;
    }
    else {
      local_440 = *plVar9;
      local_450 = (long *)*plVar5;
    }
    local_448 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_420 = *plVar9;
      lStack_418 = plVar5[3];
      local_430 = &local_420;
    }
    else {
      local_420 = *plVar9;
      local_430 = (long *)*plVar5;
    }
    local_428 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_430,(ulong)(params->algo_name)._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      uVar11 = *psVar8;
      in_stack_fffffffffffffa88 = plVar5[3];
    }
    else {
      uVar11 = *psVar8;
      _Var18._M_p = (pointer)*plVar5;
    }
    sVar19 = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffa70);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      uVar15 = *psVar8;
      in_stack_fffffffffffffa40 = plVar5[3];
      _Var13._M_p = &stack0xfffffffffffffa38;
    }
    else {
      uVar15 = *psVar8;
      _Var13._M_p = (pointer)*plVar5;
    }
    sVar14 = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&stack0xfffffffffffffab0,(string *)&stack0xfffffffffffffa28);
    if (_Var13._M_p != &stack0xfffffffffffffa38) {
      operator_delete(_Var13._M_p,uVar15 + 1);
    }
    if (_Var18._M_p != &stack0xfffffffffffffa80) {
      operator_delete(_Var18._M_p,uVar11 + 1);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,local_420 + 1);
    }
    if (local_450 != &local_440) {
      operator_delete(local_450,local_440 + 1);
    }
    if (local_470 != &local_460) {
      operator_delete(local_470,local_460 + 1);
    }
    if (local_490 != &local_480) {
      operator_delete(local_490,local_480 + 1);
    }
    if (local_4b0 != &local_4a0) {
      operator_delete(local_4b0,local_4a0 + 1);
    }
    if (local_510 != &local_500) {
      operator_delete(local_510,local_500 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if (local_530 != local_520) {
      operator_delete(local_530,local_520[0] + 1);
    }
    __stream = fopen(in_stack_fffffffffffffab0._M_p,"w");
    if (__stream == (FILE *)0x0) {
      printf("Could not write output. Please check for write permissions. Lcaoltion: %s\n",
             in_stack_fffffffffffffab0._M_p);
    }
    else {
      Parameters::Parameters(&local_2d0,params);
      WriteHeaderInOutput((FILE *)__stream,&local_2d0,cg,true_triangle_count);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.out_directory._M_dataplus._M_p != &local_2d0.out_directory.field_2) {
        operator_delete(local_2d0.out_directory._M_dataplus._M_p,
                        local_2d0.out_directory.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.algo_name._M_dataplus._M_p != &local_2d0.algo_name.field_2) {
        operator_delete(local_2d0.algo_name._M_dataplus._M_p,
                        local_2d0.algo_name.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.seed_vertices.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.seed_vertices.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.filename._M_dataplus._M_p != &local_2d0.filename.field_2) {
        operator_delete(local_2d0.filename._M_dataplus._M_p,
                        local_2d0.filename.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (params->algo_name)._M_dataplus._M_p;
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3f8,pcVar1,pcVar1 + (params->algo_name)._M_string_length);
      Parameters::Parameters(&local_180,params);
      params_01.filename._M_string_length = (size_type)local_3b8.mean_error_percentage;
      params_01.filename._M_dataplus._M_p = (pointer)local_3b8._0_8_;
      params_01.filename.field_2._M_allocated_capacity =
           (size_type)local_3b8.median_error_percentage;
      params_01.filename.field_2._8_8_ = local_3b8.stddev_error_percentage;
      params_01.seed_count = (VertexIdx)local_3b8.max_error_percentage;
      params_01.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_3b8.vertices_seen_max_percentage;
      params_01.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_3b8.edges_seen_max_percentage;
      params_01.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_3b8.query_complexity_max_percentage
      ;
      params_01.walk_length = (EdgeIdx)_Var13._M_p;
      params_01.subsample_size = sVar14;
      params_01._80_8_ = uVar15;
      params_01.sparsification_prob = (double)in_stack_fffffffffffffa40;
      params_01.algo_name._M_dataplus._M_p = (pointer)pEVar16;
      params_01.algo_name._M_string_length = (size_type)__position._M_current;
      params_01.algo_name.field_2._M_allocated_capacity = (size_type)pEVar17;
      params_01.algo_name.field_2._8_8_ = true_triangle_count;
      params_01.out_directory._M_dataplus._M_p = (pointer)cg;
      params_01.out_directory._M_string_length = (size_type)_Var18._M_p;
      params_01.out_directory.field_2._M_allocated_capacity = sVar19;
      params_01.out_directory.field_2._8_8_ = uVar11;
      params_01.print_to_console = (bool)(char)in_stack_fffffffffffffa88;
      params_01.print_to_file = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 8);
      params_01.normalization_count_available =
           (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x10);
      params_01.CSS = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x18);
      params_01.NB = (bool)(char)((ulong)in_stack_fffffffffffffa88 >> 0x20);
      params_01._165_3_ = (int3)((ulong)in_stack_fffffffffffffa88 >> 0x28);
      est_stats_01.mean_error_percentage = (double)sVar20;
      est_stats_01._0_8_ = __name._M_p;
      est_stats_01.median_error_percentage = (double)uVar21;
      est_stats_01.stddev_error_percentage = (double)in_stack_fffffffffffffaa8;
      est_stats_01.max_error_percentage = (double)in_stack_fffffffffffffab0._M_p;
      est_stats_01.vertices_seen_max_percentage = (double)in_stack_fffffffffffffab8;
      est_stats_01.edges_seen_max_percentage = (double)in_stack_fffffffffffffac0;
      est_stats_01.query_complexity_max_percentage = (double)in_stack_fffffffffffffac8;
      WriteAlgorithmOutput((FILE *)__stream,&local_3f8,params_01,est_stats_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.out_directory._M_dataplus._M_p != &local_180.out_directory.field_2) {
        operator_delete(local_180.out_directory._M_dataplus._M_p,
                        local_180.out_directory.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.algo_name._M_dataplus._M_p != &local_180.algo_name.field_2) {
        operator_delete(local_180.algo_name._M_dataplus._M_p,
                        local_180.algo_name.field_2._M_allocated_capacity + 1);
      }
      if (local_180.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.seed_vertices.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.seed_vertices.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.filename._M_dataplus._M_p != &local_180.filename.field_2) {
        operator_delete(local_180.filename._M_dataplus._M_p,
                        local_180.filename.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      WriteRawData((FILE *)__stream,
                   (vector<Estimates,_std::allocator<Estimates>_> *)&stack0xfffffffffffffa48);
      fclose(__stream);
    }
    if (__name._M_p != &stack0xfffffffffffffaa0) {
LAB_00110df4:
      operator_delete(__name._M_p,uVar21 + 1);
    }
  }
  if (in_stack_fffffffffffffab0._M_p != &stack0xfffffffffffffac0) {
    operator_delete(in_stack_fffffffffffffab0._M_p,in_stack_fffffffffffffac0 + 1);
  }
  if ((double *)local_4f0.estimate != &local_4f0.fraction_of_edges_seen) {
    operator_delete((void *)local_4f0.estimate,(long)local_4f0.fraction_of_edges_seen + 1);
  }
LAB_00110e46:
  if (pEVar16 != (pointer)0x0) {
    operator_delete(pEVar16,(long)pEVar17 - (long)pEVar16);
  }
  return;
}

Assistant:

void TriangleEstimator (CGraph *cg, Parameters params, Count true_triangle_count, TF func) {
    std::vector<Estimates> estimates;

    for (Count i = 0; i < params.no_of_repeat; i++) {
        auto startTime = std::chrono::high_resolution_clock::now();
        Estimates est = func(cg, params);
        auto endTime = std::chrono::high_resolution_clock::now();
//        std::cout << "Run " << i<<". Time taken for this run = " <<
//                  std::chrono::duration_cast<std::chrono::seconds>(endTime - startTime).count()
//                  << " seconds" << std::endl;
        estimates.push_back(est);
    }
    EstimatorStats est_stats = GetErrorStatistics(estimates, true_triangle_count);

    // Print to console
    if (params.print_to_console) {
        WriteHeaderInOutput(stdout, params, cg, true_triangle_count);
        WriteAlgorithmOutput(stdout, params.algo_name, params, est_stats);
        WriteRawData(stdout,estimates);
    }

    // print to file
    if (params.print_to_file) {
        // take current timestamp
        std::string current_time = GetTimestamp();
        // extract the input filename
        std::string out_filename = params.filename.substr(params.filename.find_last_of("/\\") + 1);

        // create the directory output/filename/algoname, if it already does not exist
        std::string directory = params.out_directory + out_filename + "/" + params.algo_name;
        DIR* dir = opendir(directory.c_str());  // try to open the directory
        if (dir) {
            // Directory exists, go on to create a file in this location
            closedir(dir);
        }
        else if (ENOENT == errno){ // Directory does not exist, try creating one
            std::string mkdir = "mkdir -p " + directory;
            if (std::system(mkdir.c_str()) == -1) {
                printf("Could not create directory output/%s/%s\n", out_filename.c_str(), params.algo_name.c_str());
                return;
            }

        }
        else {
            printf("Could not create/find directory output/%s/%s\n",out_filename.c_str(),params.algo_name.c_str());
            return;
        }

        out_filename = directory + "/" +
                        std::to_string(params.sparsification_prob) + "-" +
                        current_time + "-" + out_filename + "-" + params.algo_name + + ".txt";
        FILE *f = fopen(out_filename.c_str(), "w");
        if (!f) {
            printf("Could not write output. Please check for write permissions. Lcaoltion: %s\n",out_filename.c_str());
            return;
        }
        WriteHeaderInOutput(f, params, cg, true_triangle_count);
        WriteAlgorithmOutput(f, params.algo_name, params, est_stats);
        WriteRawData(f, estimates);

        fclose(f);
    }

}